

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O0

int __thiscall
MT32Emu::BReverbModelImpl<float>::open(BReverbModelImpl<float> *this,char *__file,int __oflag,...)

{
  BReverbSettings *pBVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  AllpassFilter<float> **ppAVar5;
  AllpassFilter<float> *this_00;
  CombFilter<float> **ppCVar6;
  TapDelayCombFilter<float> *this_01;
  CombFilter<float> *pCVar7;
  uint local_28;
  Bit32u i_1;
  uint local_14;
  Bit32u i;
  BReverbModelImpl<float> *this_local;
  
  uVar3 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])(this,__file,___oflag);
  if ((uVar3 & 1) == 0) {
    if (this->currentSettings->numberOfAllpasses != 0) {
      auVar2 = ZEXT416(this->currentSettings->numberOfAllpasses) * ZEXT816(8);
      uVar4 = auVar2._0_8_;
      if (auVar2._8_8_ != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      ppAVar5 = (AllpassFilter<float> **)operator_new__(uVar4);
      this->allpasses = ppAVar5;
      for (local_14 = 0; local_14 < this->currentSettings->numberOfAllpasses;
          local_14 = local_14 + 1) {
        this_00 = (AllpassFilter<float> *)operator_new(0x18);
        AllpassFilter<float>::AllpassFilter(this_00,this->currentSettings->allpassSizes[local_14]);
        this->allpasses[local_14] = this_00;
      }
    }
    auVar2 = ZEXT416(this->currentSettings->numberOfCombs) * ZEXT816(8);
    uVar4 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppCVar6 = (CombFilter<float> **)operator_new__(uVar4);
    this->combs = ppCVar6;
    if ((this->tapDelayMode & 1U) == 0) {
      pCVar7 = (CombFilter<float> *)operator_new(0x20);
      pBVar1 = this->currentSettings;
      DelayWithLowPassFilter<float>::DelayWithLowPassFilter
                ((DelayWithLowPassFilter<float> *)pCVar7,*pBVar1->combSizes,*pBVar1->filterFactors,
                 pBVar1->lpfAmp);
      *this->combs = pCVar7;
      for (local_28 = 1; local_28 < this->currentSettings->numberOfCombs; local_28 = local_28 + 1) {
        pCVar7 = (CombFilter<float> *)operator_new(0x20);
        CombFilter<float>::CombFilter
                  (pCVar7,this->currentSettings->combSizes[local_28],
                   this->currentSettings->filterFactors[local_28]);
        this->combs[local_28] = pCVar7;
      }
    }
    else {
      this_01 = (TapDelayCombFilter<float> *)operator_new(0x28);
      TapDelayCombFilter<float>::TapDelayCombFilter
                (this_01,*this->currentSettings->combSizes,*this->currentSettings->filterFactors);
      *this->combs = (CombFilter<float> *)this_01;
    }
    uVar3 = (*(this->super_BReverbModel)._vptr_BReverbModel[5])();
  }
  return uVar3;
}

Assistant:

void open() {
		if (isOpen()) return;
		if (currentSettings.numberOfAllpasses > 0) {
			allpasses = new AllpassFilter<Sample>*[currentSettings.numberOfAllpasses];
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				allpasses[i] = new AllpassFilter<Sample>(currentSettings.allpassSizes[i]);
			}
		}
		combs = new CombFilter<Sample>*[currentSettings.numberOfCombs];
		if (tapDelayMode) {
			*combs = new TapDelayCombFilter<Sample>(*currentSettings.combSizes, *currentSettings.filterFactors);
		} else {
			combs[0] = new DelayWithLowPassFilter<Sample>(currentSettings.combSizes[0], currentSettings.filterFactors[0], currentSettings.lpfAmp);
			for (Bit32u i = 1; i < currentSettings.numberOfCombs; i++) {
				combs[i] = new CombFilter<Sample>(currentSettings.combSizes[i], currentSettings.filterFactors[i]);
			}
		}
		mute();
	}